

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

RangeDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_rangedynamic(NeuralNetworkLayer *this)

{
  ulong uVar1;
  RangeDynamicLayerParams *pRVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x280) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x280;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pRVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::RangeDynamicLayerParams>(arena);
    (this->layer_).rangedynamic_ = pRVar2;
  }
  return (RangeDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RangeDynamicLayerParams* NeuralNetworkLayer::_internal_mutable_rangedynamic() {
  if (!_internal_has_rangedynamic()) {
    clear_layer();
    set_has_rangedynamic();
    layer_.rangedynamic_ = CreateMaybeMessage< ::CoreML::Specification::RangeDynamicLayerParams >(GetArenaForAllocation());
  }
  return layer_.rangedynamic_;
}